

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_outer_tcp.c
# Opt level: O0

int incoming_parse_cmd_data(asterism_tcp_incoming_s *incoming,uv_buf_t *buf,int *eaten)

{
  asterism_trans_proto_s *proto_00;
  int iVar1;
  undefined1 local_48 [8];
  uv_buf_t __buf;
  uint remain;
  uint16_t proto_len;
  asterism_trans_proto_s *proto;
  int *eaten_local;
  uv_buf_t *buf_local;
  asterism_tcp_incoming_s *incoming_local;
  
  if (buf->len < 4) {
    incoming_local._4_4_ = 0;
  }
  else {
    proto_00 = (asterism_trans_proto_s *)buf->base;
    __buf.len._6_2_ = ntohs(proto_00->len);
    if (proto_00->version == '\x10') {
      if (__buf.len._6_2_ < 0x1001) {
        if (buf->len < (ulong)__buf.len._6_2_) {
          incoming_local._4_4_ = 0;
        }
        else {
          if (proto_00->cmd == '\x01') {
            _asterism_log(ASTERISM_LOG_DEBUG,
                          "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(169)"
                          ,"connection join recv");
            iVar1 = parse_cmd_join(incoming,proto_00);
            if (iVar1 != 0) {
              return -1;
            }
          }
          else if (proto_00->cmd == '\x03') {
            _asterism_log(ASTERISM_LOG_DEBUG,
                          "/workspace/llm4binary/github/license_c_cmakelists/sosopop[P]asterism/src/asterism/asterism_outer_tcp.c(175)"
                          ,"connection connect ack recv");
            iVar1 = parse_cmd_connect_ack(incoming,proto_00);
            if (iVar1 != 0) {
              return -1;
            }
          }
          else {
            if (proto_00->cmd != '\x04') {
              return -1;
            }
            iVar1 = parse_cmd_ping(incoming,proto_00);
            if (iVar1 != 0) {
              return -1;
            }
          }
          *eaten = (uint)__buf.len._6_2_ + *eaten;
          __buf.len._0_4_ = (int)buf->len - (uint)__buf.len._6_2_;
          if ((uint)__buf.len == 0) {
            incoming_local._4_4_ = 0;
          }
          else {
            local_48 = (undefined1  [8])(buf->base + (int)(uint)__buf.len._6_2_);
            __buf.base = (char *)(ulong)(uint)__buf.len;
            incoming_local._4_4_ = incoming_parse_cmd_data(incoming,(uv_buf_t *)local_48,eaten);
          }
        }
      }
      else {
        incoming_local._4_4_ = -1;
      }
    }
    else {
      incoming_local._4_4_ = -1;
    }
  }
  return incoming_local._4_4_;
}

Assistant:

static int incoming_parse_cmd_data(
    struct asterism_tcp_incoming_s *incoming,
    uv_buf_t *buf,
    int *eaten)
{
    if (buf->len < sizeof(struct asterism_trans_proto_s))
        return 0;
    struct asterism_trans_proto_s *proto = (struct asterism_trans_proto_s *)buf->base;
    uint16_t proto_len = ntohs(proto->len);
    if (proto->version != ASTERISM_TRANS_PROTO_VERSION)
        return -1;
    if (proto_len > ASTERISM_MAX_PROTO_SIZE)
        return -1;
    if (proto_len > buf->len)
    {
        return 0;
    }
    if (proto->cmd == ASTERISM_TRANS_PROTO_JOIN)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection join recv");
        if (parse_cmd_join(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_CONNECT_ACK)
    {
        asterism_log(ASTERISM_LOG_DEBUG, "connection connect ack recv");
        if (parse_cmd_connect_ack(incoming, proto) != 0)
            return -1;
    }
    else if (proto->cmd == ASTERISM_TRANS_PROTO_PING)
    {
        //asterism_log(ASTERISM_LOG_DEBUG, "connection ping recv");
        if (parse_cmd_ping(incoming, proto) != 0)
            return -1;
    }
    else
    {
        return -1;
    }
    *eaten += proto_len;
    unsigned int remain = buf->len - proto_len;
    if (remain)
    {
        uv_buf_t __buf;
        __buf.base = buf->base + proto_len;
        __buf.len = remain;
        return incoming_parse_cmd_data(incoming, &__buf, eaten);
    }
    return 0;
}